

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_unziplo_16(c_v64 a,c_v64 b)

{
  return (c_v64)(b.u64 & 0xffff | (a.u64 & 0xffff00000000) << 0x10 | (a.u64 & 0xffff) << 0x20 |
                (ulong)((uint)((ulong)b >> 0x10) & 0xffff0000));
}

Assistant:

SIMD_INLINE c_v64 _c_v64_unzip_16(c_v64 a, c_v64 b, int mode) {
  c_v64 t;
  if (mode) {
    t.u16[3] = b.u16[3];
    t.u16[2] = b.u16[1];
    t.u16[1] = a.u16[3];
    t.u16[0] = a.u16[1];
  } else {
    t.u16[3] = a.u16[2];
    t.u16[2] = a.u16[0];
    t.u16[1] = b.u16[2];
    t.u16[0] = b.u16[0];
  }
  return t;
}